

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined4 uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 (*pauVar96) [16];
  long lVar97;
  uint uVar98;
  ulong uVar99;
  uint uVar100;
  ulong uVar101;
  undefined1 (*pauVar102) [16];
  ulong uVar103;
  long lVar104;
  undefined1 (*pauVar105) [16];
  Scene *pSVar106;
  ulong uVar107;
  ulong uVar108;
  long lVar109;
  undefined1 (*pauVar110) [16];
  ulong uVar111;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar117 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar124;
  float fVar128;
  float fVar129;
  undefined1 auVar125 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  undefined1 auVar140 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  float fVar154;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar157 [64];
  undefined1 auVar164 [32];
  uint uVar166;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  uint uVar170;
  uint uVar171;
  undefined1 auVar165 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  float fVar175;
  undefined1 auVar176 [32];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [64];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_284c;
  RayQueryContext *local_2848;
  undefined1 local_2840 [56];
  Geometry *local_2808;
  long local_2800;
  ulong local_27f8;
  RTCFilterFunctionNArguments local_27f0;
  undefined1 local_27c0 [32];
  float local_2790;
  float local_278c;
  float local_2788;
  float local_2784;
  float local_2780;
  undefined4 local_277c;
  uint local_2778;
  uint local_2774;
  uint local_2770;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2848 = context;
    pauVar96 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar116 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar125 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar138._8_4_ = 0x7fffffff;
    auVar138._0_8_ = 0x7fffffff7fffffff;
    auVar138._12_4_ = 0x7fffffff;
    auVar138 = vandps_avx((undefined1  [16])aVar3,auVar138);
    auVar143._8_4_ = 0x219392ef;
    auVar143._0_8_ = 0x219392ef219392ef;
    auVar143._12_4_ = 0x219392ef;
    auVar138 = vcmpps_avx(auVar138,auVar143,1);
    auVar138 = vblendvps_avx((undefined1  [16])aVar3,auVar143,auVar138);
    auVar143 = vrcpps_avx(auVar138);
    fVar124 = auVar143._0_4_;
    auVar134._0_4_ = auVar138._0_4_ * fVar124;
    fVar129 = auVar143._4_4_;
    auVar134._4_4_ = auVar138._4_4_ * fVar129;
    fVar130 = auVar143._8_4_;
    auVar134._8_4_ = auVar138._8_4_ * fVar130;
    fVar131 = auVar143._12_4_;
    auVar134._12_4_ = auVar138._12_4_ * fVar131;
    auVar144._8_4_ = 0x3f800000;
    auVar144._0_8_ = 0x3f8000003f800000;
    auVar144._12_4_ = 0x3f800000;
    auVar138 = vsubps_avx(auVar144,auVar134);
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar1;
    local_23e0._0_4_ = uVar1;
    local_23e0._8_4_ = uVar1;
    local_23e0._12_4_ = uVar1;
    local_23e0._16_4_ = uVar1;
    local_23e0._20_4_ = uVar1;
    local_23e0._24_4_ = uVar1;
    local_23e0._28_4_ = uVar1;
    auVar150 = ZEXT3264(local_23e0);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar1;
    local_2400._0_4_ = uVar1;
    local_2400._8_4_ = uVar1;
    local_2400._12_4_ = uVar1;
    local_2400._16_4_ = uVar1;
    local_2400._20_4_ = uVar1;
    local_2400._24_4_ = uVar1;
    local_2400._28_4_ = uVar1;
    auVar153 = ZEXT3264(local_2400);
    auVar135._0_4_ = fVar124 + fVar124 * auVar138._0_4_;
    auVar135._4_4_ = fVar129 + fVar129 * auVar138._4_4_;
    auVar135._8_4_ = fVar130 + fVar130 * auVar138._8_4_;
    auVar135._12_4_ = fVar131 + fVar131 * auVar138._12_4_;
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar1;
    local_2420._0_4_ = uVar1;
    local_2420._8_4_ = uVar1;
    local_2420._12_4_ = uVar1;
    local_2420._16_4_ = uVar1;
    local_2420._20_4_ = uVar1;
    local_2420._24_4_ = uVar1;
    local_2420._28_4_ = uVar1;
    auVar157 = ZEXT3264(local_2420);
    auVar138 = vshufps_avx(auVar135,auVar135,0);
    local_2440._16_16_ = auVar138;
    local_2440._0_16_ = auVar138;
    auVar165 = ZEXT3264(local_2440);
    auVar138 = vmovshdup_avx(auVar135);
    auVar143 = vshufps_avx(auVar135,auVar135,0x55);
    local_2460._16_16_ = auVar143;
    local_2460._0_16_ = auVar143;
    auVar173 = ZEXT3264(local_2460);
    auVar143 = vshufpd_avx(auVar135,auVar135,1);
    auVar134 = vshufps_avx(auVar135,auVar135,0xaa);
    uVar108 = (ulong)(auVar135._0_4_ < 0.0) * 0x20;
    uVar107 = (ulong)(auVar138._0_4_ < 0.0) << 5 | 0x40;
    local_2480._16_16_ = auVar134;
    local_2480._0_16_ = auVar134;
    auVar174 = ZEXT3264(local_2480);
    uVar111 = (ulong)(auVar143._0_4_ < 0.0) << 5 | 0x80;
    local_27f8 = uVar108 ^ 0x20;
    auVar138 = vshufps_avx(auVar116,auVar116,0);
    local_24a0._16_16_ = auVar138;
    local_24a0._0_16_ = auVar138;
    auVar177 = ZEXT3264(local_24a0);
    auVar138 = vshufps_avx(auVar125,auVar125,0);
    local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
    auVar115 = ZEXT3264(CONCAT1616(auVar138,auVar138));
    local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
    auVar118._8_4_ = 0xbf800000;
    auVar118._0_8_ = 0xbf800000bf800000;
    auVar118._12_4_ = 0xbf800000;
    auVar118._16_4_ = 0xbf800000;
    auVar118._20_4_ = 0xbf800000;
    auVar118._24_4_ = 0xbf800000;
    auVar118._28_4_ = 0xbf800000;
    auVar137._8_4_ = 0x3f800000;
    auVar137._0_8_ = 0x3f8000003f800000;
    auVar137._12_4_ = 0x3f800000;
    auVar137._16_4_ = 0x3f800000;
    auVar137._20_4_ = 0x3f800000;
    auVar137._24_4_ = 0x3f800000;
    auVar137._28_4_ = 0x3f800000;
    _local_24e0 = vblendvps_avx(auVar137,auVar118,local_24c0);
LAB_014d5249:
    do {
      pauVar110 = pauVar96 + -1;
      pauVar96 = pauVar96 + -1;
      if (*(float *)(*pauVar110 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar103 = *(ulong *)*pauVar96;
        while ((uVar103 & 8) == 0) {
          auVar146 = auVar150._0_32_;
          auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar103 + 0x40 + uVar108),auVar146);
          auVar155._4_4_ = auVar165._4_4_ * auVar118._4_4_;
          auVar155._0_4_ = auVar165._0_4_ * auVar118._0_4_;
          auVar155._8_4_ = auVar165._8_4_ * auVar118._8_4_;
          auVar155._12_4_ = auVar165._12_4_ * auVar118._12_4_;
          auVar155._16_4_ = auVar165._16_4_ * auVar118._16_4_;
          auVar155._20_4_ = auVar165._20_4_ * auVar118._20_4_;
          auVar155._24_4_ = auVar165._24_4_ * auVar118._24_4_;
          auVar155._28_4_ = auVar118._28_4_;
          auVar151 = auVar153._0_32_;
          auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar103 + 0x40 + uVar107),auVar151);
          auVar73._4_4_ = auVar173._4_4_ * auVar118._4_4_;
          auVar73._0_4_ = auVar173._0_4_ * auVar118._0_4_;
          auVar73._8_4_ = auVar173._8_4_ * auVar118._8_4_;
          auVar73._12_4_ = auVar173._12_4_ * auVar118._12_4_;
          auVar73._16_4_ = auVar173._16_4_ * auVar118._16_4_;
          auVar73._20_4_ = auVar173._20_4_ * auVar118._20_4_;
          auVar73._24_4_ = auVar173._24_4_ * auVar118._24_4_;
          auVar73._28_4_ = auVar118._28_4_;
          auVar118 = vmaxps_avx(auVar155,auVar73);
          auVar155 = auVar157._0_32_;
          auVar137 = vsubps_avx(*(undefined1 (*) [32])(uVar103 + 0x40 + uVar111),auVar155);
          auVar74._4_4_ = auVar174._4_4_ * auVar137._4_4_;
          auVar74._0_4_ = auVar174._0_4_ * auVar137._0_4_;
          auVar74._8_4_ = auVar174._8_4_ * auVar137._8_4_;
          auVar74._12_4_ = auVar174._12_4_ * auVar137._12_4_;
          auVar74._16_4_ = auVar174._16_4_ * auVar137._16_4_;
          auVar74._20_4_ = auVar174._20_4_ * auVar137._20_4_;
          auVar74._24_4_ = auVar174._24_4_ * auVar137._24_4_;
          auVar74._28_4_ = auVar137._28_4_;
          auVar137 = vmaxps_avx(auVar74,auVar177._0_32_);
          local_2660 = vmaxps_avx(auVar118,auVar137);
          auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar103 + 0x40 + local_27f8),auVar146);
          auVar75._4_4_ = auVar165._4_4_ * auVar118._4_4_;
          auVar75._0_4_ = auVar165._0_4_ * auVar118._0_4_;
          auVar75._8_4_ = auVar165._8_4_ * auVar118._8_4_;
          auVar75._12_4_ = auVar165._12_4_ * auVar118._12_4_;
          auVar75._16_4_ = auVar165._16_4_ * auVar118._16_4_;
          auVar75._20_4_ = auVar165._20_4_ * auVar118._20_4_;
          auVar75._24_4_ = auVar165._24_4_ * auVar118._24_4_;
          auVar75._28_4_ = auVar118._28_4_;
          auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar103 + 0x40 + (uVar107 ^ 0x20)),auVar151);
          auVar76._4_4_ = auVar173._4_4_ * auVar118._4_4_;
          auVar76._0_4_ = auVar173._0_4_ * auVar118._0_4_;
          auVar76._8_4_ = auVar173._8_4_ * auVar118._8_4_;
          auVar76._12_4_ = auVar173._12_4_ * auVar118._12_4_;
          auVar76._16_4_ = auVar173._16_4_ * auVar118._16_4_;
          auVar76._20_4_ = auVar173._20_4_ * auVar118._20_4_;
          auVar76._24_4_ = auVar173._24_4_ * auVar118._24_4_;
          auVar76._28_4_ = auVar118._28_4_;
          auVar118 = vminps_avx(auVar75,auVar76);
          auVar137 = vsubps_avx(*(undefined1 (*) [32])(uVar103 + 0x40 + (uVar111 ^ 0x20)),auVar155);
          auVar77._4_4_ = auVar174._4_4_ * auVar137._4_4_;
          auVar77._0_4_ = auVar174._0_4_ * auVar137._0_4_;
          auVar77._8_4_ = auVar174._8_4_ * auVar137._8_4_;
          auVar77._12_4_ = auVar174._12_4_ * auVar137._12_4_;
          auVar77._16_4_ = auVar174._16_4_ * auVar137._16_4_;
          auVar77._20_4_ = auVar174._20_4_ * auVar137._20_4_;
          auVar77._24_4_ = auVar174._24_4_ * auVar137._24_4_;
          auVar77._28_4_ = auVar137._28_4_;
          auVar137 = vminps_avx(auVar77,auVar115._0_32_);
          auVar118 = vminps_avx(auVar118,auVar137);
          auVar118 = vcmpps_avx(local_2660,auVar118,2);
          uVar100 = vmovmskps_avx(auVar118);
          if (uVar100 == 0) {
            if (pauVar96 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014d5249;
          }
          uVar100 = uVar100 & 0xff;
          uVar99 = uVar103 & 0xfffffffffffffff0;
          lVar109 = 0;
          if (uVar100 != 0) {
            for (; (uVar100 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
            }
          }
          uVar103 = *(ulong *)(uVar99 + lVar109 * 8);
          uVar100 = uVar100 - 1 & uVar100;
          if (uVar100 != 0) {
            uVar166 = *(uint *)(local_2660 + lVar109 * 4);
            lVar109 = 0;
            if (uVar100 != 0) {
              for (; (uVar100 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
              }
            }
            uVar101 = *(ulong *)(uVar99 + lVar109 * 8);
            uVar98 = *(uint *)(local_2660 + lVar109 * 4);
            uVar100 = uVar100 - 1 & uVar100;
            if (uVar100 == 0) {
              if (uVar166 < uVar98) {
                *(ulong *)*pauVar96 = uVar101;
                *(uint *)(*pauVar96 + 8) = uVar98;
                pauVar96 = pauVar96 + 1;
              }
              else {
                *(ulong *)*pauVar96 = uVar103;
                *(uint *)(*pauVar96 + 8) = uVar166;
                pauVar96 = pauVar96 + 1;
                uVar103 = uVar101;
              }
            }
            else {
              auVar116._8_8_ = 0;
              auVar116._0_8_ = uVar103;
              auVar138 = vpunpcklqdq_avx(auVar116,ZEXT416(uVar166));
              auVar125._8_8_ = 0;
              auVar125._0_8_ = uVar101;
              auVar116 = vpunpcklqdq_avx(auVar125,ZEXT416(uVar98));
              lVar109 = 0;
              if (uVar100 != 0) {
                for (; (uVar100 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
                }
              }
              auVar136._8_8_ = 0;
              auVar136._0_8_ = *(ulong *)(uVar99 + lVar109 * 8);
              auVar125 = vpunpcklqdq_avx(auVar136,ZEXT416(*(uint *)(local_2660 + lVar109 * 4)));
              uVar100 = uVar100 - 1 & uVar100;
              if (uVar100 == 0) {
                auVar143 = vpcmpgtd_avx(auVar116,auVar138);
                auVar134 = vpshufd_avx(auVar143,0xaa);
                auVar143 = vblendvps_avx(auVar116,auVar138,auVar134);
                auVar138 = vblendvps_avx(auVar138,auVar116,auVar134);
                auVar116 = vpcmpgtd_avx(auVar125,auVar143);
                auVar134 = vpshufd_avx(auVar116,0xaa);
                auVar116 = vblendvps_avx(auVar125,auVar143,auVar134);
                auVar125 = vblendvps_avx(auVar143,auVar125,auVar134);
                auVar143 = vpcmpgtd_avx(auVar125,auVar138);
                auVar134 = vpshufd_avx(auVar143,0xaa);
                auVar143 = vblendvps_avx(auVar125,auVar138,auVar134);
                auVar138 = vblendvps_avx(auVar138,auVar125,auVar134);
                *pauVar96 = auVar138;
                pauVar96[1] = auVar143;
                uVar103 = auVar116._0_8_;
                pauVar96 = pauVar96 + 2;
              }
              else {
                lVar109 = 0;
                if (uVar100 != 0) {
                  for (; (uVar100 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
                  }
                }
                auVar139._8_8_ = 0;
                auVar139._0_8_ = *(ulong *)(uVar99 + lVar109 * 8);
                auVar143 = vpunpcklqdq_avx(auVar139,ZEXT416(*(uint *)(local_2660 + lVar109 * 4)));
                uVar100 = uVar100 - 1 & uVar100;
                uVar101 = (ulong)uVar100;
                if (uVar100 == 0) {
                  auVar134 = vpcmpgtd_avx(auVar116,auVar138);
                  auVar135 = vpshufd_avx(auVar134,0xaa);
                  auVar134 = vblendvps_avx(auVar116,auVar138,auVar135);
                  auVar138 = vblendvps_avx(auVar138,auVar116,auVar135);
                  auVar116 = vpcmpgtd_avx(auVar143,auVar125);
                  auVar135 = vpshufd_avx(auVar116,0xaa);
                  auVar116 = vblendvps_avx(auVar143,auVar125,auVar135);
                  auVar125 = vblendvps_avx(auVar125,auVar143,auVar135);
                  auVar143 = vpcmpgtd_avx(auVar125,auVar138);
                  auVar135 = vpshufd_avx(auVar143,0xaa);
                  auVar143 = vblendvps_avx(auVar125,auVar138,auVar135);
                  auVar138 = vblendvps_avx(auVar138,auVar125,auVar135);
                  auVar125 = vpcmpgtd_avx(auVar116,auVar134);
                  auVar135 = vpshufd_avx(auVar125,0xaa);
                  auVar125 = vblendvps_avx(auVar116,auVar134,auVar135);
                  auVar116 = vblendvps_avx(auVar134,auVar116,auVar135);
                  auVar134 = vpcmpgtd_avx(auVar143,auVar116);
                  auVar135 = vpshufd_avx(auVar134,0xaa);
                  auVar134 = vblendvps_avx(auVar143,auVar116,auVar135);
                  auVar116 = vblendvps_avx(auVar116,auVar143,auVar135);
                  *pauVar96 = auVar138;
                  pauVar96[1] = auVar116;
                  pauVar96[2] = auVar134;
                  uVar103 = auVar125._0_8_;
                  pauVar110 = pauVar96 + 3;
                }
                else {
                  *pauVar96 = auVar138;
                  pauVar96[1] = auVar116;
                  pauVar96[2] = auVar125;
                  pauVar96[3] = auVar143;
                  lVar109 = 0x30;
                  do {
                    lVar104 = lVar109;
                    lVar109 = 0;
                    if (uVar101 != 0) {
                      for (; (uVar101 >> lVar109 & 1) == 0; lVar109 = lVar109 + 1) {
                      }
                    }
                    uVar103 = *(ulong *)(uVar99 + lVar109 * 8);
                    auVar117._8_8_ = 0;
                    auVar117._0_8_ = uVar103;
                    auVar138 = vpunpcklqdq_avx(auVar117,ZEXT416(*(uint *)(local_2660 + lVar109 * 4))
                                              );
                    *(undefined1 (*) [16])(pauVar96[1] + lVar104) = auVar138;
                    uVar101 = uVar101 & uVar101 - 1;
                    lVar109 = lVar104 + 0x10;
                  } while (uVar101 != 0);
                  pauVar110 = (undefined1 (*) [16])(pauVar96[1] + lVar104);
                  if (lVar104 + 0x10 != 0) {
                    lVar109 = 0x10;
                    pauVar102 = pauVar96;
                    do {
                      auVar138 = pauVar102[1];
                      pauVar102 = pauVar102 + 1;
                      uVar100 = vextractps_avx(auVar138,2);
                      lVar104 = lVar109;
                      do {
                        if (uVar100 <= *(uint *)(pauVar96[-1] + lVar104 + 8)) {
                          pauVar105 = (undefined1 (*) [16])(*pauVar96 + lVar104);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar96 + lVar104) =
                             *(undefined1 (*) [16])(pauVar96[-1] + lVar104);
                        lVar104 = lVar104 + -0x10;
                        pauVar105 = pauVar96;
                      } while (lVar104 != 0);
                      *pauVar105 = auVar138;
                      lVar109 = lVar109 + 0x10;
                    } while (pauVar110 != pauVar102);
                    uVar103 = *(ulong *)*pauVar110;
                  }
                }
                auVar150 = ZEXT3264(auVar146);
                auVar153 = ZEXT3264(auVar151);
                auVar157 = ZEXT3264(auVar155);
                auVar165 = ZEXT3264(auVar165._0_32_);
                auVar173 = ZEXT3264(auVar173._0_32_);
                auVar174 = ZEXT3264(auVar174._0_32_);
                auVar177 = ZEXT3264(auVar177._0_32_);
                pauVar96 = pauVar110;
              }
            }
          }
        }
        local_2800 = (ulong)((uint)uVar103 & 0xf) - 8;
        if (local_2800 != 0) {
          uVar103 = uVar103 & 0xfffffffffffffff0;
          lVar109 = 0;
          do {
            lVar97 = lVar109 * 0x60;
            pSVar106 = local_2848->scene;
            ppfVar4 = (pSVar106->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar103 + 0x40 + lVar97)];
            pfVar6 = ppfVar4[*(uint *)(uVar103 + 0x44 + lVar97)];
            pfVar7 = ppfVar4[*(uint *)(uVar103 + 0x48 + lVar97)];
            pfVar8 = ppfVar4[*(uint *)(uVar103 + 0x4c + lVar97)];
            auVar125 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar103 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 8 + lVar97)));
            auVar138 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar103 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 8 + lVar97)));
            auVar143 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 4 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0xc + lVar97)));
            auVar116 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 4 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0xc + lVar97)));
            auVar135 = vunpcklps_avx(auVar138,auVar116);
            auVar144 = vunpcklps_avx(auVar125,auVar143);
            auVar138 = vunpckhps_avx(auVar125,auVar143);
            auVar143 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar103 + 0x10 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 0x18 + lVar97)));
            auVar116 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar103 + 0x10 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 0x18 + lVar97)));
            auVar134 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 0x14 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0x1c + lVar97)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 0x14 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0x1c + lVar97)));
            auVar136 = vunpcklps_avx(auVar116,auVar125);
            auVar139 = vunpcklps_avx(auVar143,auVar134);
            auVar116 = vunpckhps_avx(auVar143,auVar134);
            auVar134 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar103 + 0x20 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 0x28 + lVar97)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar103 + 0x20 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 0x28 + lVar97)));
            auVar117 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 0x24 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0x2c + lVar97)));
            auVar143 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 0x24 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0x2c + lVar97)));
            auVar78 = vunpcklps_avx(auVar125,auVar143);
            auVar79 = vunpcklps_avx(auVar134,auVar117);
            auVar125 = vunpckhps_avx(auVar134,auVar117);
            auVar117 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar103 + 0x30 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 0x38 + lVar97)));
            auVar143 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar103 + 0x30 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar103 + 0x38 + lVar97)));
            auVar80 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar103 + 0x34 + lVar97)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar103 + 0x3c + lVar97)));
            auVar134 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar103 + 0x34 + lVar97)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar103 + 0x3c + lVar97)));
            auVar134 = vunpcklps_avx(auVar143,auVar134);
            auVar81 = vunpcklps_avx(auVar117,auVar80);
            auVar143 = vunpckhps_avx(auVar117,auVar80);
            lVar104 = uVar103 + 0x40 + lVar97;
            local_23c0 = *(undefined8 *)(lVar104 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar104 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar97 = uVar103 + 0x50 + lVar97;
            local_2680 = *(undefined8 *)(lVar97 + 0x10);
            uStack_2678 = *(undefined8 *)(lVar97 + 0x18);
            uStack_2670 = local_2680;
            uStack_2668 = uStack_2678;
            auVar140._16_16_ = auVar79;
            auVar140._0_16_ = auVar144;
            auVar145._16_16_ = auVar125;
            auVar145._0_16_ = auVar138;
            auVar152._16_16_ = auVar78;
            auVar152._0_16_ = auVar135;
            auVar119._16_16_ = auVar139;
            auVar119._0_16_ = auVar139;
            auVar147._16_16_ = auVar116;
            auVar147._0_16_ = auVar116;
            auVar126._16_16_ = auVar136;
            auVar126._0_16_ = auVar136;
            auVar164._16_16_ = auVar81;
            auVar164._0_16_ = auVar81;
            auVar172._16_16_ = auVar143;
            auVar172._0_16_ = auVar143;
            auVar112._16_16_ = auVar134;
            auVar112._0_16_ = auVar134;
            local_2840._0_32_ = vsubps_avx(auVar140,auVar119);
            auVar73 = vsubps_avx(auVar145,auVar147);
            local_2720 = auVar73;
            auVar118 = vsubps_avx(auVar152,auVar126);
            auVar137 = vsubps_avx(auVar164,auVar140);
            auVar155 = vsubps_avx(auVar172,auVar145);
            auVar74 = vsubps_avx(auVar112,auVar152);
            fVar131 = auVar74._0_4_;
            fVar175 = auVar73._0_4_;
            fVar13 = auVar74._4_4_;
            fVar178 = auVar73._4_4_;
            auVar146._4_4_ = fVar178 * fVar13;
            auVar146._0_4_ = fVar175 * fVar131;
            fVar23 = auVar74._8_4_;
            fVar179 = auVar73._8_4_;
            auVar146._8_4_ = fVar179 * fVar23;
            fVar33 = auVar74._12_4_;
            fVar180 = auVar73._12_4_;
            auVar146._12_4_ = fVar180 * fVar33;
            fVar43 = auVar74._16_4_;
            fVar181 = auVar73._16_4_;
            auVar146._16_4_ = fVar181 * fVar43;
            fVar53 = auVar74._20_4_;
            fVar182 = auVar73._20_4_;
            auVar146._20_4_ = fVar182 * fVar53;
            fVar63 = auVar74._24_4_;
            fVar183 = auVar73._24_4_;
            auVar146._24_4_ = fVar183 * fVar63;
            auVar146._28_4_ = auVar134._12_4_;
            fVar132 = auVar155._0_4_;
            fVar154 = auVar118._0_4_;
            fVar14 = auVar155._4_4_;
            fVar158 = auVar118._4_4_;
            auVar151._4_4_ = fVar158 * fVar14;
            auVar151._0_4_ = fVar154 * fVar132;
            fVar24 = auVar155._8_4_;
            fVar159 = auVar118._8_4_;
            auVar151._8_4_ = fVar159 * fVar24;
            fVar34 = auVar155._12_4_;
            fVar160 = auVar118._12_4_;
            auVar151._12_4_ = fVar160 * fVar34;
            fVar44 = auVar155._16_4_;
            fVar161 = auVar118._16_4_;
            auVar151._16_4_ = fVar161 * fVar44;
            fVar54 = auVar155._20_4_;
            fVar162 = auVar118._20_4_;
            auVar151._20_4_ = fVar162 * fVar54;
            fVar64 = auVar155._24_4_;
            uVar82 = auVar139._12_4_;
            fVar163 = auVar118._24_4_;
            auVar151._24_4_ = fVar163 * fVar64;
            auVar151._28_4_ = uVar82;
            local_2740 = vsubps_avx(auVar151,auVar146);
            fVar133 = auVar137._0_4_;
            fVar15 = auVar137._4_4_;
            auVar83._4_4_ = fVar158 * fVar15;
            auVar83._0_4_ = fVar154 * fVar133;
            fVar25 = auVar137._8_4_;
            auVar83._8_4_ = fVar159 * fVar25;
            fVar35 = auVar137._12_4_;
            auVar83._12_4_ = fVar160 * fVar35;
            fVar45 = auVar137._16_4_;
            auVar83._16_4_ = fVar161 * fVar45;
            fVar55 = auVar137._20_4_;
            auVar83._20_4_ = fVar162 * fVar55;
            fVar65 = auVar137._24_4_;
            auVar83._24_4_ = fVar163 * fVar65;
            auVar83._28_4_ = uVar82;
            fVar141 = local_2840._0_4_;
            fVar16 = local_2840._4_4_;
            auVar84._4_4_ = fVar13 * fVar16;
            auVar84._0_4_ = fVar131 * fVar141;
            fVar26 = local_2840._8_4_;
            auVar84._8_4_ = fVar23 * fVar26;
            fVar36 = local_2840._12_4_;
            auVar84._12_4_ = fVar33 * fVar36;
            fVar46 = local_2840._16_4_;
            auVar84._16_4_ = fVar43 * fVar46;
            fVar56 = local_2840._20_4_;
            auVar84._20_4_ = fVar53 * fVar56;
            fVar66 = local_2840._24_4_;
            auVar84._24_4_ = fVar63 * fVar66;
            auVar84._28_4_ = auVar136._12_4_;
            auVar118 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = fVar14 * fVar16;
            auVar85._0_4_ = fVar132 * fVar141;
            auVar85._8_4_ = fVar24 * fVar26;
            auVar85._12_4_ = fVar34 * fVar36;
            auVar85._16_4_ = fVar44 * fVar46;
            auVar85._20_4_ = fVar54 * fVar56;
            auVar85._24_4_ = fVar64 * fVar66;
            auVar85._28_4_ = auVar136._12_4_;
            auVar86._4_4_ = fVar178 * fVar15;
            auVar86._0_4_ = fVar175 * fVar133;
            auVar86._8_4_ = fVar179 * fVar25;
            auVar86._12_4_ = fVar180 * fVar35;
            auVar86._16_4_ = fVar181 * fVar45;
            auVar86._20_4_ = fVar182 * fVar55;
            auVar86._24_4_ = fVar183 * fVar65;
            auVar86._28_4_ = auVar73._28_4_;
            local_27c0 = vsubps_avx(auVar86,auVar85);
            uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar176._4_4_ = uVar1;
            auVar176._0_4_ = uVar1;
            auVar176._8_4_ = uVar1;
            auVar176._12_4_ = uVar1;
            auVar176._16_4_ = uVar1;
            auVar176._20_4_ = uVar1;
            auVar176._24_4_ = uVar1;
            auVar176._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar184._4_4_ = uVar1;
            auVar184._0_4_ = uVar1;
            auVar184._8_4_ = uVar1;
            auVar184._12_4_ = uVar1;
            auVar184._16_4_ = uVar1;
            auVar184._20_4_ = uVar1;
            auVar184._24_4_ = uVar1;
            auVar184._28_4_ = uVar1;
            uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar185._4_4_ = uVar2;
            auVar185._0_4_ = uVar2;
            auVar185._8_4_ = uVar2;
            auVar185._12_4_ = uVar2;
            auVar185._16_4_ = uVar2;
            auVar185._20_4_ = uVar2;
            auVar185._24_4_ = uVar2;
            auVar185._28_4_ = uVar2;
            fVar124 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_2700 = vsubps_avx(auVar140,auVar176);
            fVar129 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar75 = vsubps_avx(auVar145,auVar184);
            auVar76 = vsubps_avx(auVar152,auVar185);
            fVar142 = auVar76._0_4_;
            fVar17 = auVar76._4_4_;
            auVar87._4_4_ = fVar124 * fVar17;
            auVar87._0_4_ = fVar124 * fVar142;
            fVar27 = auVar76._8_4_;
            auVar87._8_4_ = fVar124 * fVar27;
            fVar37 = auVar76._12_4_;
            auVar87._12_4_ = fVar124 * fVar37;
            fVar47 = auVar76._16_4_;
            auVar87._16_4_ = fVar124 * fVar47;
            fVar57 = auVar76._20_4_;
            auVar87._20_4_ = fVar124 * fVar57;
            fVar67 = auVar76._24_4_;
            auVar87._24_4_ = fVar124 * fVar67;
            auVar87._28_4_ = uVar1;
            fVar128 = auVar75._0_4_;
            fVar18 = auVar75._4_4_;
            auVar88._4_4_ = fVar129 * fVar18;
            auVar88._0_4_ = fVar129 * fVar128;
            fVar28 = auVar75._8_4_;
            auVar88._8_4_ = fVar129 * fVar28;
            fVar38 = auVar75._12_4_;
            auVar88._12_4_ = fVar129 * fVar38;
            fVar48 = auVar75._16_4_;
            auVar88._16_4_ = fVar129 * fVar48;
            fVar58 = auVar75._20_4_;
            auVar88._20_4_ = fVar129 * fVar58;
            fVar68 = auVar75._24_4_;
            auVar88._24_4_ = fVar129 * fVar68;
            auVar88._28_4_ = uVar2;
            auVar75 = vsubps_avx(auVar88,auVar87);
            fVar130 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar9 = local_2700._0_4_;
            fVar19 = local_2700._4_4_;
            auVar89._4_4_ = fVar129 * fVar19;
            auVar89._0_4_ = fVar129 * fVar9;
            fVar29 = local_2700._8_4_;
            auVar89._8_4_ = fVar129 * fVar29;
            fVar39 = local_2700._12_4_;
            auVar89._12_4_ = fVar129 * fVar39;
            fVar49 = local_2700._16_4_;
            auVar89._16_4_ = fVar129 * fVar49;
            fVar59 = local_2700._20_4_;
            auVar89._20_4_ = fVar129 * fVar59;
            fVar69 = local_2700._24_4_;
            auVar89._24_4_ = fVar129 * fVar69;
            auVar89._28_4_ = local_2740._28_4_;
            auVar90._4_4_ = fVar130 * fVar17;
            auVar90._0_4_ = fVar130 * fVar142;
            auVar90._8_4_ = fVar130 * fVar27;
            auVar90._12_4_ = fVar130 * fVar37;
            auVar90._16_4_ = fVar130 * fVar47;
            auVar90._20_4_ = fVar130 * fVar57;
            auVar90._24_4_ = fVar130 * fVar67;
            auVar90._28_4_ = uVar82;
            auVar76 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar130 * fVar18;
            auVar91._0_4_ = fVar130 * fVar128;
            auVar91._8_4_ = fVar130 * fVar28;
            auVar91._12_4_ = fVar130 * fVar38;
            auVar91._16_4_ = fVar130 * fVar48;
            auVar91._20_4_ = fVar130 * fVar58;
            auVar91._24_4_ = fVar130 * fVar68;
            auVar91._28_4_ = uVar82;
            auVar92._4_4_ = fVar124 * fVar19;
            auVar92._0_4_ = fVar124 * fVar9;
            auVar92._8_4_ = fVar124 * fVar29;
            auVar92._12_4_ = fVar124 * fVar39;
            auVar92._16_4_ = fVar124 * fVar49;
            auVar92._20_4_ = fVar124 * fVar59;
            auVar92._24_4_ = fVar124 * fVar69;
            auVar92._28_4_ = local_2700._28_4_;
            auVar77 = vsubps_avx(auVar92,auVar91);
            fVar10 = local_27c0._0_4_;
            fVar20 = local_27c0._4_4_;
            fVar30 = local_27c0._8_4_;
            fVar40 = local_27c0._12_4_;
            fVar50 = local_27c0._16_4_;
            fVar60 = local_27c0._20_4_;
            fVar70 = local_27c0._24_4_;
            fVar11 = auVar118._0_4_;
            fVar21 = auVar118._4_4_;
            fVar31 = auVar118._8_4_;
            fVar41 = auVar118._12_4_;
            fVar51 = auVar118._16_4_;
            fVar61 = auVar118._20_4_;
            fVar71 = auVar118._24_4_;
            fVar12 = local_2740._0_4_;
            fVar22 = local_2740._4_4_;
            fVar32 = local_2740._8_4_;
            fVar42 = local_2740._12_4_;
            fVar52 = local_2740._16_4_;
            fVar62 = local_2740._20_4_;
            fVar72 = local_2740._24_4_;
            auVar127._0_4_ = fVar130 * fVar12 + fVar124 * fVar11 + fVar129 * fVar10;
            auVar127._4_4_ = fVar130 * fVar22 + fVar124 * fVar21 + fVar129 * fVar20;
            auVar127._8_4_ = fVar130 * fVar32 + fVar124 * fVar31 + fVar129 * fVar30;
            auVar127._12_4_ = fVar130 * fVar42 + fVar124 * fVar41 + fVar129 * fVar40;
            auVar127._16_4_ = fVar130 * fVar52 + fVar124 * fVar51 + fVar129 * fVar50;
            auVar127._20_4_ = fVar130 * fVar62 + fVar124 * fVar61 + fVar129 * fVar60;
            auVar127._24_4_ = fVar130 * fVar72 + fVar124 * fVar71 + fVar129 * fVar70;
            auVar127._28_4_ = fVar129 + fVar129 + local_2700._28_4_;
            auVar120._8_4_ = 0x80000000;
            auVar120._0_8_ = 0x8000000080000000;
            auVar120._12_4_ = 0x80000000;
            auVar120._16_4_ = 0x80000000;
            auVar120._20_4_ = 0x80000000;
            auVar120._24_4_ = 0x80000000;
            auVar120._28_4_ = 0x80000000;
            auVar118 = vandps_avx(auVar127,auVar120);
            uVar100 = auVar118._0_4_;
            auVar148._0_4_ =
                 (float)(uVar100 ^
                        (uint)(fVar133 * auVar75._0_4_ +
                              fVar132 * auVar76._0_4_ + fVar131 * auVar77._0_4_));
            uVar166 = auVar118._4_4_;
            auVar148._4_4_ =
                 (float)(uVar166 ^
                        (uint)(fVar15 * auVar75._4_4_ +
                              fVar14 * auVar76._4_4_ + fVar13 * auVar77._4_4_));
            uVar98 = auVar118._8_4_;
            auVar148._8_4_ =
                 (float)(uVar98 ^ (uint)(fVar25 * auVar75._8_4_ +
                                        fVar24 * auVar76._8_4_ + fVar23 * auVar77._8_4_));
            uVar167 = auVar118._12_4_;
            auVar148._12_4_ =
                 (float)(uVar167 ^
                        (uint)(fVar35 * auVar75._12_4_ +
                              fVar34 * auVar76._12_4_ + fVar33 * auVar77._12_4_));
            uVar168 = auVar118._16_4_;
            auVar148._16_4_ =
                 (float)(uVar168 ^
                        (uint)(fVar45 * auVar75._16_4_ +
                              fVar44 * auVar76._16_4_ + fVar43 * auVar77._16_4_));
            uVar169 = auVar118._20_4_;
            auVar148._20_4_ =
                 (float)(uVar169 ^
                        (uint)(fVar55 * auVar75._20_4_ +
                              fVar54 * auVar76._20_4_ + fVar53 * auVar77._20_4_));
            uVar170 = auVar118._24_4_;
            auVar148._24_4_ =
                 (float)(uVar170 ^
                        (uint)(fVar65 * auVar75._24_4_ +
                              fVar64 * auVar76._24_4_ + fVar63 * auVar77._24_4_));
            uVar171 = auVar118._28_4_;
            auVar148._28_4_ =
                 (float)(uVar171 ^ (uint)(auVar137._28_4_ + auVar155._28_4_ + auVar74._28_4_));
            auVar156._0_4_ =
                 (float)(uVar100 ^
                        (uint)(auVar75._0_4_ * fVar141 +
                              auVar76._0_4_ * fVar175 + fVar154 * auVar77._0_4_));
            auVar156._4_4_ =
                 (float)(uVar166 ^
                        (uint)(auVar75._4_4_ * fVar16 +
                              auVar76._4_4_ * fVar178 + fVar158 * auVar77._4_4_));
            auVar156._8_4_ =
                 (float)(uVar98 ^ (uint)(auVar75._8_4_ * fVar26 +
                                        auVar76._8_4_ * fVar179 + fVar159 * auVar77._8_4_));
            auVar156._12_4_ =
                 (float)(uVar167 ^
                        (uint)(auVar75._12_4_ * fVar36 +
                              auVar76._12_4_ * fVar180 + fVar160 * auVar77._12_4_));
            auVar156._16_4_ =
                 (float)(uVar168 ^
                        (uint)(auVar75._16_4_ * fVar46 +
                              auVar76._16_4_ * fVar181 + fVar161 * auVar77._16_4_));
            auVar156._20_4_ =
                 (float)(uVar169 ^
                        (uint)(auVar75._20_4_ * fVar56 +
                              auVar76._20_4_ * fVar182 + fVar162 * auVar77._20_4_));
            auVar156._24_4_ =
                 (float)(uVar170 ^
                        (uint)(auVar75._24_4_ * fVar66 +
                              auVar76._24_4_ * fVar183 + fVar163 * auVar77._24_4_));
            auVar156._28_4_ = (float)(uVar171 ^ (uint)(auVar76._28_4_ + auVar77._28_4_ + -0.0));
            auVar137 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar118 = vcmpps_avx(auVar148,auVar137,5);
            auVar137 = vcmpps_avx(auVar156,auVar137,5);
            auVar118 = vandps_avx(auVar118,auVar137);
            auVar121._8_4_ = 0x7fffffff;
            auVar121._0_8_ = 0x7fffffff7fffffff;
            auVar121._12_4_ = 0x7fffffff;
            auVar121._16_4_ = 0x7fffffff;
            auVar121._20_4_ = 0x7fffffff;
            auVar121._24_4_ = 0x7fffffff;
            auVar121._28_4_ = 0x7fffffff;
            local_2600 = vandps_avx(auVar127,auVar121);
            auVar137 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar127,4);
            auVar118 = vandps_avx(auVar118,auVar137);
            auVar122._0_4_ = auVar156._0_4_ + auVar148._0_4_;
            auVar122._4_4_ = auVar156._4_4_ + auVar148._4_4_;
            auVar122._8_4_ = auVar156._8_4_ + auVar148._8_4_;
            auVar122._12_4_ = auVar156._12_4_ + auVar148._12_4_;
            auVar122._16_4_ = auVar156._16_4_ + auVar148._16_4_;
            auVar122._20_4_ = auVar156._20_4_ + auVar148._20_4_;
            auVar122._24_4_ = auVar156._24_4_ + auVar148._24_4_;
            auVar122._28_4_ = auVar156._28_4_ + auVar148._28_4_;
            auVar155 = vcmpps_avx(auVar122,local_2600,2);
            auVar137 = vandps_avx(auVar118,auVar155);
            auVar74 = local_26a0 & auVar137;
            local_2720._0_8_ = lVar109;
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0x7f,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0xbf,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar74[0x1f] < '\0') {
              auVar137 = vandps_avx(auVar137,local_26a0);
              local_2620._0_4_ =
                   (float)(uVar100 ^ (uint)(fVar12 * fVar9 + fVar11 * fVar128 + fVar142 * fVar10));
              local_2620._4_4_ =
                   (float)(uVar166 ^ (uint)(fVar22 * fVar19 + fVar21 * fVar18 + fVar17 * fVar20));
              local_2620._8_4_ =
                   (float)(uVar98 ^ (uint)(fVar32 * fVar29 + fVar31 * fVar28 + fVar27 * fVar30));
              local_2620._12_4_ =
                   (float)(uVar167 ^ (uint)(fVar42 * fVar39 + fVar41 * fVar38 + fVar37 * fVar40));
              local_2620._16_4_ =
                   (float)(uVar168 ^ (uint)(fVar52 * fVar49 + fVar51 * fVar48 + fVar47 * fVar50));
              local_2620._20_4_ =
                   (float)(uVar169 ^ (uint)(fVar62 * fVar59 + fVar61 * fVar58 + fVar57 * fVar60));
              local_2620._24_4_ =
                   (float)(uVar170 ^ (uint)(fVar72 * fVar69 + fVar71 * fVar68 + fVar67 * fVar70));
              local_2620._28_4_ =
                   uVar171 ^ (uint)(auVar155._28_4_ + auVar155._28_4_ + auVar118._28_4_);
              fVar124 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar129 = local_2600._0_4_;
              fVar130 = local_2600._4_4_;
              auVar93._4_4_ = fVar130 * fVar124;
              auVar93._0_4_ = fVar129 * fVar124;
              fVar131 = local_2600._8_4_;
              auVar93._8_4_ = fVar131 * fVar124;
              fVar132 = local_2600._12_4_;
              auVar93._12_4_ = fVar132 * fVar124;
              fVar133 = local_2600._16_4_;
              auVar93._16_4_ = fVar133 * fVar124;
              fVar141 = local_2600._20_4_;
              auVar93._20_4_ = fVar141 * fVar124;
              fVar142 = local_2600._24_4_;
              auVar93._24_4_ = fVar142 * fVar124;
              auVar93._28_4_ = fVar124;
              auVar118 = vcmpps_avx(auVar93,local_2620,1);
              fVar124 = (ray->super_RayK<1>).tfar;
              auVar94._4_4_ = fVar130 * fVar124;
              auVar94._0_4_ = fVar129 * fVar124;
              auVar94._8_4_ = fVar131 * fVar124;
              auVar94._12_4_ = fVar132 * fVar124;
              auVar94._16_4_ = fVar133 * fVar124;
              auVar94._20_4_ = fVar141 * fVar124;
              auVar94._24_4_ = fVar142 * fVar124;
              auVar94._28_4_ = fVar124;
              auVar155 = vcmpps_avx(local_2620,auVar94,2);
              auVar118 = vandps_avx(auVar155,auVar118);
              auVar155 = auVar137 & auVar118;
              if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar155 >> 0x7f,0) != '\0') ||
                    (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar155 >> 0xbf,0) != '\0') ||
                  (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar155[0x1f] < '\0') {
                local_2840._0_8_ = pSVar106;
                local_2720._8_24_ = auVar73._8_24_;
                auVar155 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                auVar153 = ZEXT3264(auVar155);
                auVar118 = vandps_avx(auVar137,auVar118);
                auVar137 = vsubps_avx(local_2600,auVar156);
                local_2660 = vblendvps_avx(auVar148,auVar137,local_24c0);
                local_25c0 = auVar118;
                auVar137 = vsubps_avx(local_2600,auVar148);
                local_2640 = vblendvps_avx(auVar156,auVar137,local_24c0);
                uStack_2524 = local_24c0._28_4_;
                local_2540[0] = fVar12 * (float)local_24e0._0_4_;
                local_2540[1] = fVar22 * (float)local_24e0._4_4_;
                local_2540[2] = fVar32 * fStack_24d8;
                local_2540[3] = fVar42 * fStack_24d4;
                fStack_2530 = fVar52 * fStack_24d0;
                fStack_252c = fVar62 * fStack_24cc;
                fStack_2528 = fVar72 * fStack_24c8;
                local_2520[0] = fVar11 * (float)local_24e0._0_4_;
                local_2520[1] = fVar21 * (float)local_24e0._4_4_;
                local_2520[2] = fVar31 * fStack_24d8;
                local_2520[3] = fVar41 * fStack_24d4;
                fStack_2510 = fVar51 * fStack_24d0;
                fStack_250c = fVar61 * fStack_24cc;
                fStack_2508 = fVar71 * fStack_24c8;
                uStack_2504 = uStack_2524;
                local_2500[0] = (float)local_24e0._0_4_ * fVar10;
                local_2500[1] = (float)local_24e0._4_4_ * fVar20;
                local_2500[2] = fStack_24d8 * fVar30;
                local_2500[3] = fStack_24d4 * fVar40;
                fStack_24f0 = fStack_24d0 * fVar50;
                fStack_24ec = fStack_24cc * fVar60;
                fStack_24e8 = fStack_24c8 * fVar70;
                uStack_24e4 = uStack_2524;
                local_2760 = auVar118;
                auVar137 = vrcpps_avx(local_2600);
                fVar124 = auVar137._0_4_;
                fVar128 = auVar137._4_4_;
                auVar95._4_4_ = fVar130 * fVar128;
                auVar95._0_4_ = fVar129 * fVar124;
                fVar129 = auVar137._8_4_;
                auVar95._8_4_ = fVar131 * fVar129;
                fVar130 = auVar137._12_4_;
                auVar95._12_4_ = fVar132 * fVar130;
                fVar131 = auVar137._16_4_;
                auVar95._16_4_ = fVar133 * fVar131;
                fVar132 = auVar137._20_4_;
                auVar95._20_4_ = fVar141 * fVar132;
                fVar133 = auVar137._24_4_;
                auVar95._24_4_ = fVar142 * fVar133;
                auVar95._28_4_ = local_2600._28_4_;
                auVar149._8_4_ = 0x3f800000;
                auVar149._0_8_ = 0x3f8000003f800000;
                auVar149._12_4_ = 0x3f800000;
                auVar149._16_4_ = 0x3f800000;
                auVar149._20_4_ = 0x3f800000;
                auVar149._24_4_ = 0x3f800000;
                auVar149._28_4_ = 0x3f800000;
                auVar137 = vsubps_avx(auVar149,auVar95);
                fVar124 = fVar124 + fVar124 * auVar137._0_4_;
                fVar128 = fVar128 + fVar128 * auVar137._4_4_;
                fVar129 = fVar129 + fVar129 * auVar137._8_4_;
                fVar130 = fVar130 + fVar130 * auVar137._12_4_;
                fVar131 = fVar131 + fVar131 * auVar137._16_4_;
                fVar132 = fVar132 + fVar132 * auVar137._20_4_;
                fVar133 = fVar133 + fVar133 * auVar137._24_4_;
                local_2560._4_4_ = fVar128 * local_2620._4_4_;
                local_2560._0_4_ = fVar124 * local_2620._0_4_;
                local_2560._8_4_ = fVar129 * local_2620._8_4_;
                local_2560._12_4_ = fVar130 * local_2620._12_4_;
                local_2560._16_4_ = fVar131 * local_2620._16_4_;
                local_2560._20_4_ = fVar132 * local_2620._20_4_;
                local_2560._24_4_ = fVar133 * local_2620._24_4_;
                local_2560._28_4_ = auVar137._28_4_;
                auVar150 = ZEXT3264(local_2560);
                local_25a0[0] = local_2660._0_4_ * fVar124;
                local_25a0[1] = local_2660._4_4_ * fVar128;
                local_25a0[2] = local_2660._8_4_ * fVar129;
                local_25a0[3] = local_2660._12_4_ * fVar130;
                fStack_2590 = local_2660._16_4_ * fVar131;
                fStack_258c = local_2660._20_4_ * fVar132;
                fStack_2588 = local_2660._24_4_ * fVar133;
                uStack_2584 = local_2660._28_4_;
                local_2580[0] = local_2640._0_4_ * fVar124;
                local_2580[1] = local_2640._4_4_ * fVar128;
                local_2580[2] = local_2640._8_4_ * fVar129;
                local_2580[3] = local_2640._12_4_ * fVar130;
                fStack_2570 = local_2640._16_4_ * fVar131;
                fStack_256c = local_2640._20_4_ * fVar132;
                fStack_2568 = local_2640._24_4_ * fVar133;
                uStack_2564 = local_2660._28_4_;
                auVar113._8_4_ = 0x7f800000;
                auVar113._0_8_ = 0x7f8000007f800000;
                auVar113._12_4_ = 0x7f800000;
                auVar113._16_4_ = 0x7f800000;
                auVar113._20_4_ = 0x7f800000;
                auVar113._24_4_ = 0x7f800000;
                auVar113._28_4_ = 0x7f800000;
                auVar137 = vblendvps_avx(auVar113,local_2560,auVar118);
                auVar73 = vshufps_avx(auVar137,auVar137,0xb1);
                auVar73 = vminps_avx(auVar137,auVar73);
                auVar74 = vshufpd_avx(auVar73,auVar73,5);
                auVar73 = vminps_avx(auVar73,auVar74);
                auVar74 = vperm2f128_avx(auVar73,auVar73,1);
                auVar73 = vminps_avx(auVar73,auVar74);
                auVar137 = vcmpps_avx(auVar137,auVar73,0);
                auVar73 = auVar118 & auVar137;
                if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar73 >> 0x7f,0) != '\0') ||
                      (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar73 >> 0xbf,0) != '\0') ||
                    (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar73[0x1f] < '\0') {
                  auVar118 = vandps_avx(auVar137,auVar118);
                }
                uVar100 = vextractps_avx(auVar155._0_16_,1);
                uVar98 = vmovmskps_avx(auVar118);
                uVar166 = 0;
                if (uVar98 != 0) {
                  for (; (uVar98 >> uVar166 & 1) == 0; uVar166 = uVar166 + 1) {
                  }
                }
LAB_014d5b05:
                uVar99 = CONCAT44(0,uVar166);
                local_2778 = *(uint *)((long)&local_23c0 + uVar99 * 4);
                local_2808 = (pSVar106->geometries).items[local_2778].ptr;
                if ((local_2808->mask & uVar100) == 0) {
                  *(undefined4 *)(local_2760 + uVar99 * 4) = 0;
                }
                else {
                  local_26e0 = auVar153._0_32_;
                  local_26c0 = auVar150._0_32_;
                  if (local_2848->args->filter == (RTCFilterFunctionN)0x0) {
                    local_27f0.context = local_2848->user;
                    if (local_2808->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      fVar124 = local_25a0[uVar99];
                      fVar129 = local_2580[uVar99];
                      (ray->super_RayK<1>).tfar = local_2540[uVar99 - 8];
                      (ray->Ng).field_0.field_0.x = local_2540[uVar99];
                      (ray->Ng).field_0.field_0.y = local_2520[uVar99];
                      (ray->Ng).field_0.field_0.z = local_2500[uVar99];
                      ray->u = fVar124;
                      ray->v = fVar129;
                      ray->primID = *(uint *)((long)&local_2680 + uVar99 * 4);
                      ray->geomID = local_2778;
                      ray->instID[0] = (local_27f0.context)->instID[0];
                      ray->instPrimID[0] = (local_27f0.context)->instPrimID[0];
                      goto LAB_014d5969;
                    }
                  }
                  else {
                    local_27f0.context = local_2848->user;
                  }
                  local_27c0._0_8_ = local_2848->args;
                  local_2790 = local_2540[uVar99];
                  local_278c = local_2520[uVar99];
                  local_2788 = local_2500[uVar99];
                  local_2784 = local_25a0[uVar99];
                  local_2780 = local_2580[uVar99];
                  local_277c = *(undefined4 *)((long)&local_2680 + uVar99 * 4);
                  local_2774 = (local_27f0.context)->instID[0];
                  local_2770 = (local_27f0.context)->instPrimID[0];
                  local_2700._0_8_ = uVar99;
                  (ray->super_RayK<1>).tfar = local_2540[uVar99 - 8];
                  local_284c = -1;
                  local_27f0.valid = &local_284c;
                  local_27f0.geometryUserPtr = local_2808->userPtr;
                  local_2740._0_8_ = ray;
                  local_27f0.ray = (RTCRayN *)ray;
                  local_27f0.hit = (RTCHitN *)&local_2790;
                  local_27f0.N = 1;
                  if ((local_2808->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*local_2808->intersectionFilterN)(&local_27f0), *local_27f0.valid != 0)) {
                    if ((*(code **)(local_27c0._0_8_ + 0x10) != (code *)0x0) &&
                       ((((*(byte *)local_27c0._0_8_ & 2) != 0 ||
                         (((local_2808->field_8).field_0x2 & 0x40) != 0)) &&
                        ((**(code **)(local_27c0._0_8_ + 0x10))(&local_27f0), *local_27f0.valid == 0
                        )))) goto LAB_014d5d8f;
                    (((Vec3f *)((long)local_27f0.ray + 0x30))->field_0).field_0.x =
                         *(float *)local_27f0.hit;
                    (((Vec3f *)((long)local_27f0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_27f0.hit + 4);
                    (((Vec3f *)((long)local_27f0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_27f0.hit + 8);
                    *(float *)((long)local_27f0.ray + 0x3c) = *(float *)(local_27f0.hit + 0xc);
                    *(float *)((long)local_27f0.ray + 0x40) = *(float *)(local_27f0.hit + 0x10);
                    *(float *)((long)local_27f0.ray + 0x44) = *(float *)(local_27f0.hit + 0x14);
                    *(float *)((long)local_27f0.ray + 0x48) = *(float *)(local_27f0.hit + 0x18);
                    *(float *)((long)local_27f0.ray + 0x4c) = *(float *)(local_27f0.hit + 0x1c);
                    *(float *)((long)local_27f0.ray + 0x50) = *(float *)(local_27f0.hit + 0x20);
                  }
                  else {
LAB_014d5d8f:
                    *(undefined4 *)(local_2740._0_8_ + 0x20) = local_26e0._0_4_;
                  }
                  ray = (RayHit *)local_2740._0_8_;
                  fVar124 = ((RayK<1> *)local_2740._0_8_)->tfar;
                  auVar114._4_4_ = fVar124;
                  auVar114._0_4_ = fVar124;
                  auVar114._8_4_ = fVar124;
                  auVar114._12_4_ = fVar124;
                  auVar114._16_4_ = fVar124;
                  auVar114._20_4_ = fVar124;
                  auVar114._24_4_ = fVar124;
                  auVar114._28_4_ = fVar124;
                  *(undefined4 *)(local_2760 + local_2700._0_8_ * 4) = 0;
                  auVar150 = ZEXT3264(local_26c0);
                  auVar118 = vcmpps_avx(local_26c0,auVar114,2);
                  local_2760 = vandps_avx(auVar118,local_2760);
                  uVar100 = (ray->super_RayK<1>).mask;
                  auVar153 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                  pSVar106 = (Scene *)local_2840._0_8_;
                }
                if ((((((((local_2760 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2760 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2760 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2760 >> 0x7f,0) == '\0') &&
                      (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2760 >> 0xbf,0) == '\0') &&
                    (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2760[0x1f]) goto LAB_014d5969;
                auVar123._8_4_ = 0x7f800000;
                auVar123._0_8_ = 0x7f8000007f800000;
                auVar123._12_4_ = 0x7f800000;
                auVar123._16_4_ = 0x7f800000;
                auVar123._20_4_ = 0x7f800000;
                auVar123._24_4_ = 0x7f800000;
                auVar123._28_4_ = 0x7f800000;
                auVar118 = vblendvps_avx(auVar123,auVar150._0_32_,local_2760);
                auVar137 = vshufps_avx(auVar118,auVar118,0xb1);
                auVar137 = vminps_avx(auVar118,auVar137);
                auVar155 = vshufpd_avx(auVar137,auVar137,5);
                auVar137 = vminps_avx(auVar137,auVar155);
                auVar155 = vperm2f128_avx(auVar137,auVar137,1);
                auVar137 = vminps_avx(auVar137,auVar155);
                auVar137 = vcmpps_avx(auVar118,auVar137,0);
                auVar155 = local_2760 & auVar137;
                auVar118 = local_2760;
                if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar155 >> 0x7f,0) != '\0') ||
                      (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar155 >> 0xbf,0) != '\0') ||
                    (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar155[0x1f] < '\0') {
                  auVar118 = vandps_avx(auVar137,local_2760);
                }
                uVar98 = vmovmskps_avx(auVar118);
                uVar166 = 0;
                if (uVar98 != 0) {
                  for (; (uVar98 >> uVar166 & 1) == 0; uVar166 = uVar166 + 1) {
                  }
                }
                goto LAB_014d5b05;
              }
            }
LAB_014d5969:
            lVar109 = local_2720._0_8_ + 1;
          } while (lVar109 != local_2800);
        }
        fVar124 = (ray->super_RayK<1>).tfar;
        auVar115 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar124,CONCAT420(fVar124,CONCAT416(fVar124,
                                                  CONCAT412(fVar124,CONCAT48(fVar124,CONCAT44(
                                                  fVar124,fVar124))))))));
        auVar150 = ZEXT3264(local_23e0);
        auVar153 = ZEXT3264(local_2400);
        auVar157 = ZEXT3264(local_2420);
        auVar165 = ZEXT3264(local_2440);
        auVar173 = ZEXT3264(local_2460);
        auVar174 = ZEXT3264(local_2480);
        auVar177 = ZEXT3264(local_24a0);
      }
    } while (pauVar96 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }